

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O2

void __thiscall
slang::ast::ParameterBuilder::createDecls
          (ParameterBuilder *this,Scope *scope,ParameterDeclarationBaseSyntax *syntax,bool isLocal,
          bool isPort,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *results)

{
  long lVar1;
  Compilation *pCVar2;
  DeclaratorSyntax *args_2;
  TypeAssignmentSyntax *args_2_00;
  ParameterDeclarationSyntax *paramSyntax;
  undefined7 in_register_00000081;
  const_iterator __begin3;
  bool local_52;
  bool local_51;
  iterator_base<const_slang::syntax::DeclaratorSyntax_*> local_50;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_40;
  
  local_40._M_ptr = (pointer)CONCAT71(in_register_00000081,isPort);
  local_51 = SUB81(syntax,0);
  local_52 = isLocal;
  local_40._M_extent._M_extent_value = (size_t)results;
  if (*(int *)&scope->compilation == 0x15e) {
    local_50.index = 0;
    lVar1 = *(long *)&scope[1].deferredMemberIndex;
    local_50.list = (ParentList *)&scope->importData;
    for (; (local_50.list != (ParentList *)&scope->importData || (local_50.index != lVar1 + 1U >> 1)
           ); local_50.index = local_50.index + 1) {
      args_2 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
               iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&local_50);
      SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
      emplace_back<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)attributes._M_ptr,
                 (Scope *)this,(ParameterDeclarationSyntax *)scope,args_2,&local_51,&local_52,
                 &local_40);
    }
  }
  else {
    local_50.index = 0;
    pCVar2 = scope[2].compilation;
    local_50.list = (ParentList *)&scope[1].thisSym;
    for (; (local_50.list != (ParentList *)&scope[1].thisSym ||
           (local_50.index != (ulong)((long)&(pCVar2->super_BumpAllocator).head + 1) >> 1));
        local_50.index = local_50.index + 1) {
      args_2_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::
                  iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>::dereference
                            ((iterator_base<const_slang::syntax::TypeAssignmentSyntax_*> *)&local_50
                            );
      SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
      emplace_back<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)attributes._M_ptr,
                 (Scope *)this,(TypeParameterDeclarationSyntax *)scope,args_2_00,&local_51,&local_52
                 ,&local_40);
    }
  }
  return;
}

Assistant:

void ParameterBuilder::createDecls(const Scope& scope, const ParameterDeclarationBaseSyntax& syntax,
                                   bool isLocal, bool isPort,
                                   std::span<const AttributeInstanceSyntax* const> attributes,
                                   SmallVectorBase<Decl>& results) {
    if (syntax.kind == SyntaxKind::ParameterDeclaration) {
        auto& paramSyntax = syntax.as<ParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
    else {
        auto& paramSyntax = syntax.as<TypeParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
}